

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

AssertionResult __thiscall
testing::internal::CmpHelperFloatingPointEQ<double>
          (internal *this,char *lhs_expression,char *rhs_expression,double lhs_value,
          double rhs_value)

{
  double dVar1;
  char *pcVar2;
  bool bVar3;
  ostream *poVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar5
  ;
  AssertionResult AVar6;
  stringstream local_3b0 [32];
  stringstream local_390 [36];
  int local_36c;
  stringstream local_368 [8];
  stringstream rhs_ss;
  ostream local_358 [396];
  int local_1cc;
  stringstream local_1c8 [8];
  stringstream lhs_ss;
  ostream local_1b8 [376];
  FloatingPoint<double> local_40;
  FloatingPoint<double> rhs;
  FloatingPoint<double> lhs;
  double rhs_value_local;
  double lhs_value_local;
  char *rhs_expression_local;
  char *lhs_expression_local;
  
  lhs.u_ = (FloatingPointUnion)rhs_value;
  rhs_value_local = lhs_value;
  lhs_value_local = (double)rhs_expression;
  rhs_expression_local = lhs_expression;
  lhs_expression_local = (char *)this;
  FloatingPoint<double>::FloatingPoint(&rhs,&rhs_value_local);
  FloatingPoint<double>::FloatingPoint(&local_40,(double *)&lhs);
  bVar3 = FloatingPoint<double>::AlmostEquals(&rhs,&local_40);
  if (bVar3) {
    testing::AssertionSuccess();
    sVar5.ptr_ = extraout_RDX;
  }
  else {
    std::__cxx11::stringstream::stringstream(local_1c8);
    local_1cc = (int)std::setprecision(0x11);
    poVar4 = std::operator<<(local_1b8,(_Setprecision)local_1cc);
    std::ostream::operator<<(poVar4,rhs_value_local);
    std::__cxx11::stringstream::stringstream(local_368);
    local_36c = (int)std::setprecision(0x11);
    poVar4 = std::operator<<(local_358,(_Setprecision)local_36c);
    std::ostream::operator<<(poVar4,(double)lhs.u_);
    pcVar2 = rhs_expression_local;
    dVar1 = lhs_value_local;
    testing::internal::StringStreamToString(local_390);
    testing::internal::StringStreamToString(local_3b0);
    testing::internal::EqFailure
              ((char *)this,pcVar2,(string *)dVar1,(string *)local_390,SUB81(local_3b0,0));
    std::__cxx11::string::~string((string *)local_3b0);
    std::__cxx11::string::~string((string *)local_390);
    std::__cxx11::stringstream::~stringstream(local_368);
    std::__cxx11::stringstream::~stringstream(local_1c8);
    sVar5.ptr_ = extraout_RDX_00;
  }
  AVar6.message_.ptr_ = sVar5.ptr_;
  AVar6._0_8_ = this;
  return AVar6;
}

Assistant:

AssertionResult CmpHelperFloatingPointEQ(const char* lhs_expression,
                                         const char* rhs_expression,
                                         RawType lhs_value,
                                         RawType rhs_value) {
  const FloatingPoint<RawType> lhs(lhs_value), rhs(rhs_value);

  if (lhs.AlmostEquals(rhs)) {
    return AssertionSuccess();
  }

  ::std::stringstream lhs_ss;
  lhs_ss << std::setprecision(std::numeric_limits<RawType>::digits10 + 2)
         << lhs_value;

  ::std::stringstream rhs_ss;
  rhs_ss << std::setprecision(std::numeric_limits<RawType>::digits10 + 2)
         << rhs_value;

  return EqFailure(lhs_expression,
                   rhs_expression,
                   StringStreamToString(&lhs_ss),
                   StringStreamToString(&rhs_ss),
                   false);
}